

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall
Fl_Text_Display::xy_to_rowcol(Fl_Text_Display *this,int X,int Y,int *row,int *column,int posType)

{
  int local_48;
  int fontWidth;
  int fontHeight;
  int posType_local;
  int *column_local;
  int *row_local;
  int Y_local;
  int X_local;
  Fl_Text_Display *this_local;
  
  *row = (Y - (this->text_area).y) / this->mMaxsize;
  if (*row < 0) {
    *row = 0;
  }
  if (this->mNVisibleLines <= *row) {
    *row = this->mNVisibleLines + -1;
  }
  if (posType == 0) {
    local_48 = 3;
  }
  else {
    local_48 = 0;
  }
  *column = ((X - (this->text_area).x) + this->mHorizOffset + local_48) / 6;
  if (*column < 0) {
    *column = 0;
  }
  return;
}

Assistant:

void Fl_Text_Display::xy_to_rowcol( int X, int Y, int *row,
                                   int *column, int posType ) const {
  int fontHeight = mMaxsize;
  int fontWidth = TMPFONTWIDTH;   //mFontStruct->max_bounds.width;

  /* Find the visible line number corresponding to the Y coordinate */
  *row = ( Y - text_area.y ) / fontHeight;
  if ( *row < 0 ) *row = 0;
  if ( *row >= mNVisibleLines ) *row = mNVisibleLines - 1;

  *column = ( ( X - text_area.x ) + mHorizOffset +
             ( posType == CURSOR_POS ? fontWidth / 2 : 0 ) ) / fontWidth;
  if ( *column < 0 ) * column = 0;
}